

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMpsFF.cpp
# Opt level: O0

Parsekey __thiscall
free_format_parser::HMpsFF::parseRhs(HMpsFF *this,HighsLogOptions *log_options,istream *file)

{
  HMpsFF *pHVar1;
  bool bVar2;
  __type _Var3;
  undefined8 uVar4;
  HMpsFF *in_RSI;
  long in_RDI;
  istream *log_options_;
  double value_1;
  bool is_nan_1;
  iterator mit_1;
  double value;
  bool is_nan;
  iterator mit;
  size_t end_marker;
  string marker;
  HighsInt rowidx;
  Parsekey key;
  string word;
  size_t end;
  size_t begin;
  size_t report_ignored_duplicate_rhs_frequency;
  size_t num_ignored_duplicate_rhs;
  size_t report_ignored_row_name_frequency;
  size_t num_ignored_row_name;
  bool skip;
  bool has_entry;
  anon_class_8_1_8991fb9c addRhs;
  anon_class_8_1_8991fb9c parseName;
  string strline;
  undefined4 in_stack_fffffffffffffd28;
  int in_stack_fffffffffffffd2c;
  HMpsFF *in_stack_fffffffffffffd30;
  HMpsFF *in_stack_fffffffffffffd38;
  istream *in_stack_fffffffffffffd40;
  HMpsFF *in_stack_fffffffffffffd48;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  in_stack_fffffffffffffd50;
  string *in_stack_fffffffffffffd58;
  anon_class_8_1_8991fb9c *in_stack_fffffffffffffd60;
  size_t in_stack_fffffffffffffd68;
  HMpsFF *in_stack_fffffffffffffd70;
  string *in_stack_fffffffffffffd78;
  undefined6 in_stack_fffffffffffffd80;
  undefined1 in_stack_fffffffffffffd86;
  undefined1 in_stack_fffffffffffffd87;
  HMpsFF *in_stack_fffffffffffffd88;
  HMpsFF *in_stack_fffffffffffffda0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  in_stack_fffffffffffffda8;
  bool local_1f2;
  bool local_1f1;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  in_stack_fffffffffffffe38;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  in_stack_fffffffffffffe40;
  size_t *in_stack_fffffffffffffe48;
  string *in_stack_fffffffffffffe50;
  undefined8 in_stack_fffffffffffffe58;
  string local_198;
  HighsLogOptions *local_178;
  byte local_169;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_168;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_160;
  string local_158 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_138;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_130;
  string local_128 [32];
  anon_class_8_1_8991fb9c *local_108;
  string local_100 [40];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_d8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_d0;
  Parsekey local_c4;
  string local_c0 [32];
  anon_class_8_1_8991fb9c *local_a0;
  anon_class_8_1_8991fb9c *local_98;
  int local_8c;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  byte local_66;
  byte local_65;
  undefined1 local_51;
  string local_40 [40];
  HMpsFF *local_18;
  Parsekey local_4;
  
  local_18 = in_RSI;
  std::__cxx11::string::string(local_40);
  local_51 = 0;
  std::vector<bool,_std::allocator<bool>_>::assign
            ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffd30,
             CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),(bool *)0x460317);
  *(undefined1 *)(in_RDI + 0x230) = 0;
  local_65 = 0;
  local_70 = 0;
  local_78 = 1;
  local_80 = 0;
  local_88 = 1;
  while( true ) {
    do {
      bVar2 = getMpsLine(in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,
                         (string *)in_stack_fffffffffffffd38,(bool *)in_stack_fffffffffffffd30);
      if (!bVar2) {
        local_4 = kFail;
        local_8c = 1;
        goto LAB_0046108a;
      }
    } while ((local_66 & 1) != 0);
    bVar2 = timeout(in_stack_fffffffffffffd30);
    if (bVar2) break;
    local_98 = (anon_class_8_1_8991fb9c *)0x0;
    local_a0 = (anon_class_8_1_8991fb9c *)0x0;
    std::__cxx11::string::string(local_c0);
    local_c4 = checkFirstWord((HMpsFF *)in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                              in_stack_fffffffffffffe48,(size_t *)in_stack_fffffffffffffe40._M_cur,
                              (string *)in_stack_fffffffffffffe38._M_cur);
    if ((local_c4 == kNone) || (local_c4 == kRhs)) {
      local_1f2 = false;
      if (local_c4 == kNone) {
        local_d0._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                    (key_type *)0x460598);
        local_d8._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
        local_1f2 = std::__detail::operator!=(&local_d0,&local_d8);
      }
      if (local_1f2 != false) {
        local_a0 = local_98;
      }
      first_word((string *)in_stack_fffffffffffffda8._M_cur,(size_t)in_stack_fffffffffffffda0);
      local_108 = (anon_class_8_1_8991fb9c *)
                  first_word_end((string *)in_stack_fffffffffffffd88,
                                 CONCAT17(in_stack_fffffffffffffd87,
                                          CONCAT16(in_stack_fffffffffffffd86,
                                                   in_stack_fffffffffffffd80)));
      std::__cxx11::string::operator=(local_c0,"");
      first_word((string *)in_stack_fffffffffffffda8._M_cur,(size_t)in_stack_fffffffffffffda0);
      std::__cxx11::string::operator=(local_c0,local_128);
      std::__cxx11::string::~string(local_128);
      local_a0 = (anon_class_8_1_8991fb9c *)
                 first_word_end((string *)in_stack_fffffffffffffd88,
                                CONCAT17(in_stack_fffffffffffffd87,
                                         CONCAT16(in_stack_fffffffffffffd86,
                                                  in_stack_fffffffffffffd80)));
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffd30,
                              (char *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28))
      ;
      if (bVar2) {
        trim((string *)in_stack_fffffffffffffd30,
             (string *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
        pHVar1 = local_18;
        uVar4 = std::__cxx11::string::c_str();
        highsLogUser((HighsLogOptions *)pHVar1,kError,"No bound given for row \"%s\"\n",uVar4);
        local_4 = kFail;
        local_8c = 1;
      }
      else {
        local_130._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                    (key_type *)0x4607c0);
        local_138._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
        bVar2 = std::__detail::operator==(&local_130,&local_138);
        if ((bVar2) &&
           (_Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffffd50._M_cur,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffffd48), _Var3)) {
          std::__cxx11::string::operator=(local_100,local_c0);
          local_108 = local_a0;
          std::__cxx11::string::operator=(local_c0,"");
          first_word((string *)in_stack_fffffffffffffda8._M_cur,(size_t)in_stack_fffffffffffffda0);
          std::__cxx11::string::operator=(local_c0,local_158);
          std::__cxx11::string::~string(local_158);
          local_a0 = (anon_class_8_1_8991fb9c *)
                     first_word_end((string *)in_stack_fffffffffffffd88,
                                    CONCAT17(in_stack_fffffffffffffd87,
                                             CONCAT16(in_stack_fffffffffffffd86,
                                                      in_stack_fffffffffffffd80)));
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffd30,
                                  (char *)CONCAT44(in_stack_fffffffffffffd2c,
                                                   in_stack_fffffffffffffd28));
          if (bVar2) {
            trim((string *)in_stack_fffffffffffffd30,
                 (string *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
            pHVar1 = local_18;
            uVar4 = std::__cxx11::string::c_str();
            highsLogUser((HighsLogOptions *)pHVar1,kError,"No bound given for SIF row \"%s\"\n",
                         uVar4);
            local_4 = kFail;
            local_8c = 1;
            goto LAB_00461026;
          }
          in_stack_fffffffffffffda8._M_cur =
               (__node_type *)
               std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                       *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                      (key_type *)0x46099f);
          local_160._M_cur = in_stack_fffffffffffffda8._M_cur;
          local_130._M_cur = in_stack_fffffffffffffda8._M_cur;
        }
        local_168._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
        bVar2 = std::__detail::operator==(&local_130,&local_168);
        if (bVar2) {
          local_70 = local_70 + 1;
          if (local_70 % local_78 == 0) {
            in_stack_fffffffffffffda0 = local_18;
            std::__cxx11::string::c_str();
            highsLogUser((HighsLogOptions *)in_stack_fffffffffffffda0,kWarning,
                         "Row name \"%s\" in RHS section is not defined: ignored\n");
            local_78 = local_78 << 1;
          }
        }
        else {
          local_169 = 0;
          local_178 = (HighsLogOptions *)
                      getValue((HMpsFF *)
                               CONCAT17(in_stack_fffffffffffffd87,
                                        CONCAT16(in_stack_fffffffffffffd86,in_stack_fffffffffffffd80
                                                )),in_stack_fffffffffffffd78,
                               (bool *)in_stack_fffffffffffffd70,
                               (HighsInt)(in_stack_fffffffffffffd68 >> 0x20));
          parseRhs::anon_class_8_1_8991fb9c::operator()
                    (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                     (HighsInt *)in_stack_fffffffffffffd50._M_cur,(bool *)in_stack_fffffffffffffd48)
          ;
          pHVar1 = local_18;
          if ((local_65 & 1) == 0) {
            if ((local_169 & 1) != 0) {
              in_stack_fffffffffffffd88 = local_18;
              uVar4 = std::__cxx11::string::c_str();
              highsLogUser((HighsLogOptions *)in_stack_fffffffffffffd88,kError,
                           "RHS for row \"%s\" is NaN\n",uVar4);
              local_4 = kFail;
              local_8c = 1;
              goto LAB_00461026;
            }
            parseRhs::anon_class_8_1_8991fb9c::operator()
                      (in_stack_fffffffffffffd60,(double)in_stack_fffffffffffffd58,
                       (HighsInt)((ulong)in_stack_fffffffffffffd50._M_cur >> 0x20));
          }
          else {
            local_80 = local_80 + 1;
            if (local_80 % local_88 == 0) {
              std::__cxx11::string::c_str();
              highsLogUser(local_178,(HighsLogType)pHVar1,(char *)0x4,
                           "Row name \"%s\" in RHS section has duplicate value %g: ignored\n");
              local_88 = local_88 << 1;
            }
          }
        }
        in_stack_fffffffffffffd87 =
             is_end((string *)in_stack_fffffffffffffd48,(size_t)in_stack_fffffffffffffd40,
                    (string *)in_stack_fffffffffffffd38);
        if ((bool)in_stack_fffffffffffffd87) {
LAB_0046101b:
          local_8c = 0;
        }
        else {
          first_word((string *)in_stack_fffffffffffffda8._M_cur,(size_t)in_stack_fffffffffffffda0);
          in_stack_fffffffffffffd78 = &local_198;
          std::__cxx11::string::operator=(local_100,(string *)in_stack_fffffffffffffd78);
          std::__cxx11::string::~string((string *)in_stack_fffffffffffffd78);
          in_stack_fffffffffffffd86 =
               std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffffd30,
                               (char *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28)
                              );
          if ((bool)in_stack_fffffffffffffd86) {
            trim((string *)in_stack_fffffffffffffd30,
                 (string *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
            in_stack_fffffffffffffd70 = local_18;
            uVar4 = std::__cxx11::string::c_str();
            highsLogUser((HighsLogOptions *)in_stack_fffffffffffffd70,kError,
                         "No coefficient given for rhs of row \"%s\"\n",uVar4);
            local_4 = kFail;
            local_8c = 1;
          }
          else {
            in_stack_fffffffffffffd68 =
                 first_word_end((string *)in_stack_fffffffffffffd88,
                                CONCAT17(in_stack_fffffffffffffd87,
                                         CONCAT16(in_stack_fffffffffffffd86,
                                                  in_stack_fffffffffffffd80)));
            local_108 = (anon_class_8_1_8991fb9c *)in_stack_fffffffffffffd68;
            std::__cxx11::string::operator=(local_c0,"");
            local_108 = (anon_class_8_1_8991fb9c *)((long)local_108 + 1);
            first_word((string *)in_stack_fffffffffffffda8._M_cur,(size_t)in_stack_fffffffffffffda0)
            ;
            in_stack_fffffffffffffd58 = (string *)&stack0xfffffffffffffe48;
            std::__cxx11::string::operator=(local_c0,(string *)in_stack_fffffffffffffd58);
            std::__cxx11::string::~string((string *)in_stack_fffffffffffffd58);
            in_stack_fffffffffffffd60 =
                 (anon_class_8_1_8991fb9c *)
                 first_word_end((string *)in_stack_fffffffffffffd88,
                                CONCAT17(in_stack_fffffffffffffd87,
                                         CONCAT16(in_stack_fffffffffffffd86,
                                                  in_stack_fffffffffffffd80)));
            local_a0 = in_stack_fffffffffffffd60;
            in_stack_fffffffffffffd50._M_cur =
                 (__node_type *)
                 std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                         *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                        (key_type *)0x460dd0);
            in_stack_fffffffffffffe40._M_cur = in_stack_fffffffffffffd50._M_cur;
            in_stack_fffffffffffffe38._M_cur =
                 (__node_type *)
                 std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                        *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
            bVar2 = std::__detail::operator==
                              ((_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                                *)&stack0xfffffffffffffe40,
                               (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                                *)&stack0xfffffffffffffe38);
            if (!bVar2) {
              parseRhs::anon_class_8_1_8991fb9c::operator()
                        (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                         (HighsInt *)in_stack_fffffffffffffd50._M_cur,
                         (bool *)in_stack_fffffffffffffd48);
              log_options_ = (istream *)
                             getValue((HMpsFF *)
                                      CONCAT17(in_stack_fffffffffffffd87,
                                               CONCAT16(in_stack_fffffffffffffd86,
                                                        in_stack_fffffffffffffd80)),
                                      in_stack_fffffffffffffd78,(bool *)in_stack_fffffffffffffd70,
                                      (HighsInt)(in_stack_fffffffffffffd68 >> 0x20));
              if ((local_65 & 1) == 0) {
                parseRhs::anon_class_8_1_8991fb9c::operator()
                          (in_stack_fffffffffffffd60,(double)in_stack_fffffffffffffd58,
                           (HighsInt)((ulong)in_stack_fffffffffffffd50._M_cur >> 0x20));
                in_stack_fffffffffffffd40 = log_options_;
              }
              else {
                local_80 = local_80 + 1;
                in_stack_fffffffffffffd40 = log_options_;
                if (local_80 % local_88 == 0) {
                  in_stack_fffffffffffffd38 = local_18;
                  uVar4 = std::__cxx11::string::c_str();
                  highsLogUser((HighsLogOptions *)log_options_,
                               (HighsLogType)in_stack_fffffffffffffd38,(char *)0x4,
                               "Row name \"%s\" in RHS section has duplicate value %g: ignored\n",
                               uVar4);
                  local_88 = local_88 << 1;
                }
              }
              goto LAB_0046101b;
            }
            local_70 = local_70 + 1;
            if (local_70 % local_78 == 0) {
              in_stack_fffffffffffffd48 = local_18;
              uVar4 = std::__cxx11::string::c_str();
              highsLogUser((HighsLogOptions *)in_stack_fffffffffffffd48,kWarning,
                           "Row name \"%s\" in RHS section is not defined: ignored\n",uVar4);
              local_78 = local_78 << 1;
            }
            local_8c = 2;
          }
        }
      }
LAB_00461026:
      std::__cxx11::string::~string(local_100);
    }
    else {
      local_1f1 = local_70 != 0 || local_80 != 0;
      *(bool *)(in_RDI + 8) = local_1f1;
      if ((*(byte *)(in_RDI + 8) & 1) != 0) {
        highsLogUser((HighsLogOptions *)local_18,kWarning,
                     "RHS section: ignored %d undefined rows and %d duplicate values\n",
                     local_70 & 0xffffffff,local_80 & 0xffffffff);
      }
      highsLogDev((HighsLogOptions *)local_18,kInfo,"readMPS: Read RHS     OK\n");
      local_4 = local_c4;
      local_8c = 1;
    }
    std::__cxx11::string::~string(local_c0);
    in_stack_fffffffffffffd2c = local_8c;
    if ((local_8c != 0) && (local_8c != 2)) {
LAB_0046108a:
      std::__cxx11::string::~string(local_40);
      return local_4;
    }
  }
  local_4 = kTimeout;
  local_8c = 1;
  goto LAB_0046108a;
}

Assistant:

HMpsFF::Parsekey HMpsFF::parseRhs(const HighsLogOptions& log_options,
                                  std::istream& file) {
  std::string strline;

  auto parseName = [this](const std::string& name, HighsInt& rowidx,
                          bool& has_entry) {
    auto mit = rowname2idx.find(name);

    assert(mit != rowname2idx.end());
    rowidx = mit->second;

    assert(rowidx < num_row);

    if (rowidx > -1) {
      has_entry = has_row_entry_[rowidx];
    } else {
      assert(rowidx == -1);
      has_entry = has_obj_entry_;
    }
  };

  auto addRhs = [this](double val, HighsInt rowidx) {
    if (rowidx > -1) {
      if (row_type[rowidx] == Boundtype::kEq ||
          row_type[rowidx] == Boundtype::kLe) {
        assert(size_t(rowidx) < row_upper.size());
        row_upper[rowidx] = val;
      }
      if (row_type[rowidx] == Boundtype::kEq ||
          row_type[rowidx] == Boundtype::kGe) {
        assert(size_t(rowidx) < row_lower.size());
        row_lower[rowidx] = val;
      }
      has_row_entry_[rowidx] = true;
    } else {
      // objective shift
      assert(rowidx == -1);
      obj_offset = -val;
      has_obj_entry_ = true;
    }
  };

  // Initialise tracking for duplicate entries
  has_row_entry_.assign(num_row, false);
  has_obj_entry_ = false;
  bool has_entry = false;

  bool skip;
  size_t num_ignored_row_name = 0;
  size_t report_ignored_row_name_frequency = 1;
  size_t num_ignored_duplicate_rhs = 0;
  size_t report_ignored_duplicate_rhs_frequency = 1;
  while (getMpsLine(file, strline, skip)) {
    if (skip) continue;
    if (timeout()) return HMpsFF::Parsekey::kTimeout;

    size_t begin = 0;
    size_t end = 0;
    std::string word;
    HMpsFF::Parsekey key = checkFirstWord(strline, begin, end, word);

    // start of new section?
    if (key != Parsekey::kNone && key != Parsekey::kRhs) {
      warning_issued_ =
          num_ignored_row_name > 0 || num_ignored_duplicate_rhs > 0;
      if (warning_issued_)
        highsLogUser(
            log_options, HighsLogType::kWarning,
            "RHS section: ignored %d undefined rows and %d duplicate values\n",
            int(num_ignored_row_name), int(num_ignored_duplicate_rhs));
      highsLogDev(log_options, HighsLogType::kInfo,
                  "readMPS: Read RHS     OK\n");
      return key;
    }

    // Ignore lack of name for SIF format;
    // we know we have this case when "word" is a row name
    if ((key == Parsekey::kNone) && (key != Parsekey::kRhs) &&
        (rowname2idx.find(word) != rowname2idx.end())) {
      end = begin;
    }

    HighsInt rowidx;

    std::string marker = first_word(strline, end);
    size_t end_marker = first_word_end(strline, end);

    // here marker is the row name and end marks its end
    word = "";
    word = first_word(strline, end_marker);
    end = first_word_end(strline, end_marker);

    if (word == "") {
      trim(marker);
      highsLogUser(log_options, HighsLogType::kError,
                   "No bound given for row \"%s\"\n", marker.c_str());
      return HMpsFF::Parsekey::kFail;
    }

    auto mit = rowname2idx.find(marker);

    // SIF format sometimes has the name of the MPS file
    // prepended to the RHS entry; remove it here if
    // that's the case. "word" will then hold the marker,
    // so also get new "word" and "end" values
    if (mit == rowname2idx.end()) {
      if (marker == mps_name) {
        marker = word;
        end_marker = end;
        word = "";
        word = first_word(strline, end_marker);
        end = first_word_end(strline, end_marker);
        if (word == "") {
          trim(marker);
          highsLogUser(log_options, HighsLogType::kError,
                       "No bound given for SIF row \"%s\"\n", marker.c_str());
          return HMpsFF::Parsekey::kFail;
        }
        mit = rowname2idx.find(marker);
      }
    }

    if (mit == rowname2idx.end()) {
      num_ignored_row_name++;
      if (num_ignored_row_name % report_ignored_row_name_frequency == 0) {
        highsLogUser(log_options, HighsLogType::kWarning,
                     "Row name \"%s\" in RHS section is not defined: ignored\n",
                     marker.c_str());
        report_ignored_row_name_frequency *= 2;
      }
    } else {
      bool is_nan = false;
      double value = getValue(word, is_nan);  // atof(word.c_str());
      parseName(marker, rowidx, has_entry);
      if (has_entry) {
        num_ignored_duplicate_rhs++;
        if (num_ignored_duplicate_rhs %
                report_ignored_duplicate_rhs_frequency ==
            0) {
          highsLogUser(log_options, HighsLogType::kWarning,
                       "Row name \"%s\" in RHS section has duplicate value %g: "
                       "ignored\n",
                       marker.c_str(), value);
          report_ignored_duplicate_rhs_frequency *= 2;
        }
      } else {
        if (is_nan) {
          highsLogUser(log_options, HighsLogType::kError,
                       "RHS for row \"%s\" is NaN\n", marker.c_str());
          return HMpsFF::Parsekey::kFail;
        }
        addRhs(value, rowidx);
      }
    }

    if (!is_end(strline, end)) {
      // parse second coefficient
      marker = first_word(strline, end);
      if (word == "") {
        trim(marker);
        highsLogUser(log_options, HighsLogType::kError,
                     "No coefficient given for rhs of row \"%s\"\n",
                     marker.c_str());
        return HMpsFF::Parsekey::kFail;
      }
      end_marker = first_word_end(strline, end);

      // here marker is the row name and end marks its end
      word = "";
      end_marker++;
      word = first_word(strline, end_marker);
      end = first_word_end(strline, end_marker);

      assert(is_end(strline, end));

      auto mit = rowname2idx.find(marker);
      if (mit == rowname2idx.end()) {
        num_ignored_row_name++;
        if (num_ignored_row_name % report_ignored_row_name_frequency == 0) {
          highsLogUser(
              log_options, HighsLogType::kWarning,
              "Row name \"%s\" in RHS section is not defined: ignored\n",
              marker.c_str());
          report_ignored_row_name_frequency *= 2;
        }
        continue;
      };

      parseName(marker, rowidx, has_entry);
      bool is_nan = false;
      double value = getValue(word, is_nan);  // atof(word.c_str());
      if (has_entry) {
        num_ignored_duplicate_rhs++;
        if (num_ignored_duplicate_rhs %
                report_ignored_duplicate_rhs_frequency ==
            0) {
          highsLogUser(log_options, HighsLogType::kWarning,
                       "Row name \"%s\" in RHS section has duplicate value %g: "
                       "ignored\n",
                       marker.c_str(), value);
          report_ignored_duplicate_rhs_frequency *= 2;
        }
      } else {
        if (is_nan) {
          highsLogUser(log_options, HighsLogType::kError,
                       "RHS for row \"%s\" is NaN\n", marker.c_str());
          return HMpsFF::Parsekey::kFail;
        }
        addRhs(value, rowidx);
      }
    }
  }

  return Parsekey::kFail;
}